

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandBuffer.cpp
# Opt level: O0

void __thiscall
myvk::CommandBuffer::CmdBindPipeline(CommandBuffer *this,Ptr<PipelineBase> *pipeline)

{
  VkCommandBuffer pVVar1;
  PFN_vkCmdBindPipeline p_Var2;
  VkPipelineBindPoint VVar3;
  element_type *peVar4;
  VkPipeline pVVar5;
  long in_RDI;
  
  p_Var2 = vkCmdBindPipeline;
  pVVar1 = *(VkCommandBuffer *)(in_RDI + 0x28);
  peVar4 = std::__shared_ptr_access<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2ac624);
  VVar3 = (*(peVar4->super_DeviceObjectBase).super_Base._vptr_Base[3])();
  peVar4 = std::__shared_ptr_access<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2ac63b);
  pVVar5 = PipelineBase::GetHandle(peVar4);
  (*p_Var2)(pVVar1,VVar3,pVVar5);
  return;
}

Assistant:

void CommandBuffer::CmdBindPipeline(const Ptr<PipelineBase> &pipeline) const {
	vkCmdBindPipeline(m_command_buffer, pipeline->GetBindPoint(), pipeline->GetHandle());
}